

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O3

Vec_Int_t * Mio_SopVar1(int i)

{
  Vec_Int_t *p;
  int *piVar1;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  piVar1 = (int *)malloc(0x40);
  p->pArray = piVar1;
  Vec_IntPush(p,2 << ((char)i * '\x02' & 0x1fU));
  return p;
}

Assistant:

Vec_Int_t * Mio_SopVar1( int i )
{
    Vec_Int_t * vSop;
    vSop = Vec_IntAlloc( 1 );
    Vec_IntPush( vSop, Mio_CubeVar1(i) );
    return vSop;
}